

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::XFormWidget::drawRotateHandles(XFormWidget *this)

{
  const_reference pvVar1;
  const_reference this_00;
  const_reference pvVar2;
  double __x;
  double local_1b8;
  Vector3D local_1b0;
  double local_198;
  Vector3D local_190;
  Vector3D local_178;
  Vector3D local_160;
  undefined1 local_148 [8];
  Vector3D q2;
  Vector3D local_128;
  double local_110;
  Vector3D local_108;
  Vector3D local_f0;
  Vector3D local_d8;
  undefined1 local_c0 [8];
  Vector3D q1;
  double theta2;
  double theta1;
  undefined1 local_90 [4];
  int j;
  Vector3D e2;
  Vector3D e1;
  undefined1 local_58 [4];
  int i;
  double local_40;
  double r;
  Vector3D c;
  int nSides;
  double boxSize;
  XFormWidget *this_local;
  
  c.z._4_4_ = 0x40;
  if ((this->target).object != (SceneObject *)0x0) {
    Vector3D::Vector3D((Vector3D *)&r,&this->center);
    Vector3D::operator-((Vector3D *)local_58,&(this->bounds).max,&(this->bounds).min);
    local_40 = Vector3D::norm((Vector3D *)local_58);
    local_40 = local_40 / 2.0;
    glLineWidth(0x41000000);
    glBegin(1);
    for (e1.z._4_4_ = 0; e1.z._4_4_ < 3; e1.z._4_4_ = e1.z._4_4_ + 1) {
      pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                         (&this->axes,(long)((e1.z._4_4_ + 1) % 3));
      Vector3D::Vector3D((Vector3D *)&e2.z,pvVar1);
      pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                         (&this->axes,(long)((e1.z._4_4_ + 2) % 3));
      Vector3D::Vector3D((Vector3D *)local_90,pvVar1);
      this_00 = std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator[](&this->axisColors,(long)e1.z._4_4_);
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_00,0);
      glColor4ubv(pvVar2);
      for (theta1._4_4_ = 0; theta1._4_4_ < 0x40; theta1._4_4_ = theta1._4_4_ + 1) {
        __x = ((double)theta1._4_4_ * 6.283185307179586) / 64.0;
        q1.z = ((double)(theta1._4_4_ + 1) * 6.283185307179586) / 64.0;
        local_110 = cos(__x);
        CMU462::operator*(&local_108,&local_110,(Vector3D *)&e2.z);
        q2.z = sin(__x);
        CMU462::operator*(&local_128,&q2.z,(Vector3D *)local_90);
        Vector3D::operator-(&local_f0,&local_108,&local_128);
        CMU462::operator*(&local_d8,&local_40,&local_f0);
        Vector3D::operator+((Vector3D *)local_c0,(Vector3D *)&r,&local_d8);
        local_198 = cos(q1.z);
        CMU462::operator*(&local_190,&local_198,(Vector3D *)&e2.z);
        local_1b8 = sin(q1.z);
        CMU462::operator*(&local_1b0,&local_1b8,(Vector3D *)local_90);
        Vector3D::operator-(&local_178,&local_190,&local_1b0);
        CMU462::operator*(&local_160,&local_40,&local_178);
        Vector3D::operator+((Vector3D *)local_148,(Vector3D *)&r,&local_160);
        glVertex3dv(local_c0);
        glVertex3dv(local_148);
      }
    }
    glEnd();
    drawCenterHandle(this);
    glLineWidth(0x3f800000);
  }
  return;
}

Assistant:

void XFormWidget::drawRotateHandles() const
{
   const double boxSize = .2;
   const int nSides = 64;

   if( target.object == nullptr ) return;
   
   Vector3D c = center;
   double r = (bounds.max - bounds.min).norm() / 2.;

   glLineWidth( 8. );
   glBegin( GL_LINES );
   for( int i = 0; i < 3; i++ )
   {
      Vector3D e1 = axes[(i+1)%3];
      Vector3D e2 = axes[(i+2)%3];

      glColor4ubv( &axisColors[i][0] );

      for( int j = 0; j < nSides; j++ )
      {
         double theta1 = 2.*M_PI * (double)(j+0) / (double)nSides;
         double theta2 = 2.*M_PI * (double)(j+1) / (double)nSides;

         Vector3D q1 = c + r * ( cos(theta1)*e1 - sin(theta1)*e2 );
         Vector3D q2 = c + r * ( cos(theta2)*e1 - sin(theta2)*e2 );

         glVertex3dv( &q1.x );
         glVertex3dv( &q2.x );
      }
   }
   glEnd();

   drawCenterHandle();

   glLineWidth( 1. );
}